

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainerRequirementsDocs.cpp
# Opt level: O1

void __thiscall
VerifyAllCombinationsOnContainer::MinimalContainerInterfaceForVerifyAllCombinations::
MinimalContainerInterfaceForVerifyAllCombinations
          (MinimalContainerInterfaceForVerifyAllCombinations *this)

{
  int local_1c [3];
  
  (this->super_ContainerType).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->super_ContainerType).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->super_ContainerType).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->super_ContainerType).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->super_ContainerType).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->super_ContainerType).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->super_ContainerType).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->super_ContainerType).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->super_ContainerType).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->super_ContainerType).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)this,0);
  local_1c[2] = 10;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this->super_ContainerType,local_1c + 2);
  local_1c[1] = 0x14;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this->super_ContainerType,local_1c + 1);
  local_1c[0] = 0x1e;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this->super_ContainerType,local_1c);
  return;
}

Assistant:

MinimalContainerInterfaceForVerifyAllCombinations()
        {
            push_back(10);
            push_back(20);
            push_back(30);
        }